

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O2

void map2json_createJsonString(csafestring_t *buffer,map2json_tree_t *tree)

{
  jsmntype_t jVar1;
  map2json_tree_t *tree_00;
  long lVar2;
  
  while( true ) {
    if (tree == (map2json_tree_t *)0x0) {
      return;
    }
    if (tree->key != (char *)0x0) {
      safe_strchrappend(buffer,'\"');
      safe_strcat(buffer,tree->key);
      safe_strchrappend(buffer,'\"');
      safe_strchrappend(buffer,':');
    }
    jVar1 = tree->type;
    if (jVar1 == JSMN_OBJECT) {
      safe_strchrappend(buffer,'{');
      map2json_createJsonString(buffer,tree->children);
      safe_strchrappend(buffer,'}');
      jVar1 = tree->type;
    }
    if (jVar1 == JSMN_ARRAY) {
      safe_strchrappend(buffer,'[');
      for (lVar2 = 0; tree_00 = tree, lVar2 < tree->maxArrayId; lVar2 = lVar2 + 1) {
        while (tree_00 = tree_00->arrayObjects, tree_00 != (map2json_tree_t *)0x0) {
          if (tree_00->arrayId == lVar2) {
            map2json_createJsonString(buffer,tree_00);
          }
        }
        if (lVar2 < tree->maxArrayId + -1) {
          safe_strchrappend(buffer,',');
        }
      }
      safe_strchrappend(buffer,']');
      jVar1 = tree->type;
    }
    if (jVar1 - JSMN_STRING < 2) {
      if (jVar1 == JSMN_STRING) {
        safe_strchrappend(buffer,'\"');
      }
      safe_strcat(buffer,tree->value);
      if (tree->type == JSMN_STRING) {
        safe_strchrappend(buffer,'\"');
      }
    }
    if (tree->next == (s_map2json_tree *)0x0) break;
    safe_strchrappend(buffer,',');
    tree = tree->next;
  }
  return;
}

Assistant:

static void map2json_createJsonString(csafestring_t *buffer, map2json_tree_t *tree) {
	DEBUG_TEXT("map2json_createJsonString(%s, [map2json_tree_t *])... ", buffer->data);

	if ( tree == NULL ) {
		DEBUG_TEXT("map2json_createJsonString(%s, [map2json_tree_t *])... DONE", buffer->data);
		return;
	}

	if ( tree->key != NULL ) {
		safe_strchrappend(buffer, '\"');
		safe_strcat(buffer, tree->key);
		safe_strchrappend(buffer, '\"');
		safe_strchrappend(buffer, ':');
	}

	if ( tree->type == JSMN_OBJECT ) {
		safe_strchrappend(buffer, '{');
		map2json_createJsonString(buffer, tree->children);
		safe_strchrappend(buffer, '}');
	}

	if ( tree->type == JSMN_ARRAY ) {
		map2json_createJsonStringArray(buffer, tree);
	}

	if ( tree->type == JSMN_PRIMITIVE || tree->type == JSMN_STRING ) {
		if ( tree->type == JSMN_STRING ) {
			safe_strchrappend(buffer, '\"');
		}
		safe_strcat(buffer, tree->value);
		if ( tree->type == JSMN_STRING ) {
			safe_strchrappend(buffer, '\"');
		}
	}

	if ( tree->next != NULL ) {
		safe_strchrappend(buffer, ',');
		map2json_createJsonString(buffer, tree->next);
	}
	DEBUG_TEXT("map2json_createJsonString(%s, [map2json_tree_t *])... DONE", buffer->data);
}